

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall soplex::SPxMainSM<double>::SPxMainSM(SPxMainSM<double> *this,TYPE ttype)

{
  double dVar1;
  long in_FS_OFFSET;
  
  SPxSimplifier<double>::SPxSimplifier(&this->super_SPxSimplifier<double>,"MainSM",ttype);
  (this->super_SPxSimplifier<double>)._vptr_SPxSimplifier = (_func_int **)&PTR__SPxMainSM_0069e470;
  (this->m_cBasisStat).data = (VarStatus *)0x0;
  (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cBasisStat).memFactor = 1.2;
  (this->m_cBasisStat).thesize = 0;
  (this->m_cBasisStat).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&(this->m_cBasisStat).data,1);
  (this->m_rBasisStat).data = (VarStatus *)0x0;
  (this->m_rBasisStat).memFactor = 1.2;
  (this->m_rBasisStat).thesize = 0;
  (this->m_rBasisStat).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&(this->m_rBasisStat).data,1);
  (this->m_cIdx).data = (int *)0x0;
  (this->m_cIdx).memFactor = 1.2;
  (this->m_cIdx).thesize = 0;
  (this->m_cIdx).themax = 1;
  spx_alloc<int*>(&(this->m_cIdx).data,1);
  (this->m_rIdx).data = (int *)0x0;
  (this->m_rIdx).memFactor = 1.2;
  (this->m_rIdx).thesize = 0;
  (this->m_rIdx).themax = 1;
  spx_alloc<int*>(&(this->m_rIdx).data,1);
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::Array(&this->m_hist,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_classSetRows,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_classSetCols,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_dupRows,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_dupCols,0);
  this->m_postsolved = false;
  (this->m_stat).data = (int *)0x0;
  (this->m_stat).memFactor = 1.2;
  (this->m_stat).thesize = 0x10;
  (this->m_stat).themax = 0x10;
  spx_alloc<int*>(&(this->m_stat).data,0x10);
  this->m_thesense = MAXIMIZE;
  this->m_keepbounds = false;
  this->m_addedcols = 0;
  this->m_result = OKAY;
  ::soplex::infinity::__tls_init();
  dVar1 = *(double *)(in_FS_OFFSET + -8);
  this->m_cutoffbound = -dVar1;
  ::soplex::infinity::__tls_init();
  this->m_pseudoobj = -dVar1;
  return;
}

Assistant:

SPxMainSM(Timer::TYPE ttype = Timer::USER_TIME)
      : SPxSimplifier<R>("MainSM", ttype)
      , m_postsolved(0)
      , m_stat(16)
      , m_thesense(SPxLPBase<R>::MAXIMIZE)
      , m_keepbounds(false)
      , m_addedcols(0)
      , m_result(this->OKAY)
      , m_cutoffbound(R(-infinity))
      , m_pseudoobj(R(-infinity))
   {}